

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_proxy_stderr.c
# Opt level: O0

void log_proxy_stderr(Plug *plug,ProxyStderrBuf *psb,void *vdata,size_t len)

{
  void *pvVar1;
  char *pcVar2;
  size_t __n;
  bool bVar3;
  size_t newsize;
  char *msg_1;
  char *msg;
  size_t endpos;
  char *nlpos;
  size_t pos;
  size_t to_consume;
  char *data;
  size_t len_local;
  void *vdata_local;
  ProxyStderrBuf *psb_local;
  Plug *plug_local;
  
  to_consume = (size_t)vdata;
  data = (char *)len;
  while( true ) {
    if (data == (char *)0x0) {
      return;
    }
    if (0x1fff < psb->size) break;
    pos = 0x2000 - psb->size;
    if (data < pos) {
      pos = (size_t)data;
    }
    memcpy(psb->buf + psb->size,(void *)to_consume,pos);
    to_consume = pos + to_consume;
    data = data + -pos;
    psb->size = pos + psb->size;
    nlpos = (char *)0x0;
    while ((nlpos < (char *)psb->size &&
           (pvVar1 = memchr(nlpos + (long)psb->buf,10,psb->size - (long)nlpos),
           pvVar1 != (void *)0x0))) {
      msg = (char *)((long)pvVar1 - (long)psb);
      while( true ) {
        bVar3 = false;
        if ((nlpos < msg) && (bVar3 = true, (msg + -1)[(long)psb->buf] != '\n')) {
          bVar3 = (msg + -1)[(long)psb->buf] == '\r';
        }
        if (!bVar3) break;
        msg = msg + -1;
      }
      pcVar2 = dupprintf("proxy: %.*s",(ulong)(uint)((int)msg - (int)nlpos),nlpos + (long)psb->buf);
      plug_log(plug,3,(SockAddr *)0x0,0,pcVar2,0);
      safefree(pcVar2);
      nlpos = (char *)((long)pvVar1 + (1 - (long)psb));
      if ((char *)psb->size < nlpos) {
        __assert_fail("pos <= psb->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/log_proxy_stderr.c"
                      ,0x42,"void log_proxy_stderr(Plug *, ProxyStderrBuf *, const void *, size_t)")
        ;
      }
    }
    if ((nlpos == (char *)0x0) && (psb->size == 0x2000)) {
      pcVar2 = dupprintf("proxy (partial line): %.*s",psb->size & 0xffffffff,psb);
      plug_log(plug,3,(SockAddr *)0x0,0,pcVar2,0);
      safefree(pcVar2);
      psb->size = 0;
      nlpos = (char *)0x0;
    }
    __n = psb->size - (long)nlpos;
    if (__n != 0) {
      memmove(psb,nlpos + (long)psb->buf,__n);
    }
    psb->size = __n;
  }
  __assert_fail("psb->size < lenof(psb->buf)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/log_proxy_stderr.c"
                ,0x23,"void log_proxy_stderr(Plug *, ProxyStderrBuf *, const void *, size_t)");
}

Assistant:

void log_proxy_stderr(Plug *plug, ProxyStderrBuf *psb,
                      const void *vdata, size_t len)
{
    const char *data = (const char *)vdata;

    /*
     * This helper function allows us to collect the data written to a
     * local proxy command's standard error in whatever size chunks we
     * happen to get from its pipe, and whenever we have a complete
     * line, we pass it to plug_log.
     *
     * (We also do this when the buffer in psb fills up, to avoid just
     * allocating more and more memory forever, and also to keep Event
     * Log lines reasonably bounded in size.)
     *
     * Prerequisites: a plug to log to, and a ProxyStderrBuf stored
     * somewhere to collect any not-yet-output partial line.
     */

    while (len > 0) {
        /*
         * Copy as much data into psb->buf as will fit.
         */
        assert(psb->size < lenof(psb->buf));
        size_t to_consume = lenof(psb->buf) - psb->size;
        if (to_consume > len)
            to_consume = len;
        memcpy(psb->buf + psb->size, data, to_consume);
        data += to_consume;
        len -= to_consume;
        psb->size += to_consume;

        /*
         * Output any full lines in psb->buf.
         */
        size_t pos = 0;
        while (pos < psb->size) {
            char *nlpos = memchr(psb->buf + pos, '\n', psb->size - pos);
            if (!nlpos)
                break;

            /*
             * Found a newline in the buffer, so we can output a line.
             */
            size_t endpos = nlpos - psb->buf;
            while (endpos > pos && (psb->buf[endpos-1] == '\n' ||
                                    psb->buf[endpos-1] == '\r'))
                endpos--;
            char *msg = dupprintf(
                "proxy: %.*s", (int)(endpos - pos), psb->buf + pos);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, msg, 0);
            sfree(msg);

            pos = nlpos - psb->buf + 1;
            assert(pos <= psb->size);
        }

        /*
         * If the buffer is completely full and we didn't output
         * anything, then output the whole thing, flagging it as a
         * truncated line.
         */
        if (pos == 0 && psb->size == lenof(psb->buf)) {
            char *msg = dupprintf(
                "proxy (partial line): %.*s", (int)psb->size, psb->buf);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, msg, 0);
            sfree(msg);

            pos = psb->size = 0;
        }

        /*
         * Now move any remaining data up to the front of the buffer.
         */
        size_t newsize = psb->size - pos;
        if (newsize)
            memmove(psb->buf, psb->buf + pos, newsize);
        psb->size = newsize;

        /*
         * And loop round again if there's more data to be read from
         * our input.
         */
    }
}